

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O2

bool __thiscall Vehicle::is_point_on_vehicle(Vehicle *this,Point *p)

{
  int iVar1;
  int iVar2;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *plVar3;
  _List_node_base *p_Var4;
  shared_ptr<VehicleState> value_;
  __shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  plVar3 = &this->nodes;
  p_Var4 = (_List_node_base *)plVar3;
  do {
    p_Var4 = (((_List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar3) break;
    std::__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1));
    iVar1 = (local_40._M_ptr)->p->id;
    iVar2 = p->id;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  } while (iVar1 != iVar2);
  return p_Var4 != (_List_node_base *)plVar3;
}

Assistant:

bool Vehicle::is_point_on_vehicle(Point *p) {
    for (auto value_: nodes) {
        if (value_->p->id == p->id) {
            return true;
        }
    }
    return false;
}